

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O3

CURLcode Curl_setblobopt(curl_blob **blobp,curl_blob *blob)

{
  size_t sVar1;
  undefined4 uVar2;
  CURLcode CVar3;
  curl_blob *pcVar4;
  char *pcVar5;
  
  (*Curl_cfree)(*blobp);
  *blobp = (curl_blob *)0x0;
  CVar3 = CURLE_OK;
  if (blob != (curl_blob *)0x0) {
    CVar3 = CURLE_BAD_FUNCTION_ARGUMENT;
    if ((char *)blob->len < "bject") {
      pcVar5 = (char *)0x18;
      if ((blob->flags & 1) != 0) {
        pcVar5 = (char *)blob->len + 0x18;
      }
      pcVar4 = (curl_blob *)(*Curl_cmalloc)((size_t)pcVar5);
      if (pcVar4 == (curl_blob *)0x0) {
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
      else {
        uVar2 = *(undefined4 *)&blob->field_0x14;
        pcVar4->flags = blob->flags;
        *(undefined4 *)&pcVar4->field_0x14 = uVar2;
        sVar1 = blob->len;
        pcVar4->data = blob->data;
        pcVar4->len = sVar1;
        if ((blob->flags & 1) != 0) {
          pcVar4->data = pcVar4 + 1;
          memcpy(pcVar4 + 1,blob->data,blob->len);
        }
        *blobp = pcVar4;
        CVar3 = CURLE_OK;
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_setblobopt(struct curl_blob **blobp,
                         const struct curl_blob *blob)
{
  /* free the previous storage at `blobp' and replace by a dynamic storage
     copy of blob. If CURL_BLOB_COPY is set, the data is copied. */

  Curl_safefree(*blobp);

  if(blob) {
    struct curl_blob *nblob;
    if(blob->len > CURL_MAX_INPUT_LENGTH)
      return CURLE_BAD_FUNCTION_ARGUMENT;
    nblob = (struct curl_blob *)
      malloc(sizeof(struct curl_blob) +
             ((blob->flags & CURL_BLOB_COPY) ? blob->len : 0));
    if(!nblob)
      return CURLE_OUT_OF_MEMORY;
    *nblob = *blob;
    if(blob->flags & CURL_BLOB_COPY) {
      /* put the data after the blob struct in memory */
      nblob->data = (char *)nblob + sizeof(struct curl_blob);
      memcpy(nblob->data, blob->data, blob->len);
    }

    *blobp = nblob;
    return CURLE_OK;
  }

  return CURLE_OK;
}